

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.cc
# Opt level: O1

uint64_t kratos::XXHash64::hash(void *input,uint64_t length,uint64_t seed)

{
  uint64_t uVar1;
  undefined1 auStack_68 [8];
  XXHash64 hasher;
  
  auStack_68 = (undefined1  [8])(seed + 0x60ea27eeadc0b5d6);
  hasher.buffer[8] = '\0';
  hasher.buffer[9] = '\0';
  hasher.buffer[10] = '\0';
  hasher.buffer[0xb] = '\0';
  hasher.buffer[0xc] = '\0';
  hasher.buffer[0xd] = '\0';
  hasher.buffer[0xe] = '\0';
  hasher.buffer[0xf] = '\0';
  hasher.buffer[0x10] = '\0';
  hasher.buffer[0x11] = '\0';
  hasher.buffer[0x12] = '\0';
  hasher.buffer[0x13] = '\0';
  hasher.buffer[0x14] = '\0';
  hasher.buffer[0x15] = '\0';
  hasher.buffer[0x16] = '\0';
  hasher.buffer[0x17] = '\0';
  hasher.state[3] = 0;
  hasher.buffer[0] = '\0';
  hasher.buffer[1] = '\0';
  hasher.buffer[2] = '\0';
  hasher.buffer[3] = '\0';
  hasher.buffer[4] = '\0';
  hasher.buffer[5] = '\0';
  hasher.buffer[6] = '\0';
  hasher.buffer[7] = '\0';
  hasher.state[0] = seed + 0xc2b2ae3d27d4eb4f;
  hasher.state[2] = seed + 0x61c8864e7a143579;
  hasher.buffer[0x18] = '\0';
  hasher.buffer[0x19] = '\0';
  hasher.buffer[0x1a] = '\0';
  hasher.buffer[0x1b] = '\0';
  hasher.bufferSize = 0;
  hasher._68_4_ = 0;
  hasher.state[1] = seed;
  add((XXHash64 *)auStack_68,input,length);
  uVar1 = hash((XXHash64 *)auStack_68);
  return uVar1;
}

Assistant:

static uint64_t hash(const void* input, uint64_t length, uint64_t seed) {
        XXHash64 hasher(seed);
        hasher.add(input, length);
        return hasher.hash();
    }